

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_io.cc
# Opt level: O2

void core::image::jpg_error_handler(j_common_ptr param_1)

{
  Exception *this;
  string local_40;
  allocator local_19;
  
  this = (Exception *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_40,"JPEG format not recognized",&local_19);
  util::Exception::Exception(this,&local_40);
  __cxa_throw(this,&util::Exception::typeinfo,util::Exception::~Exception);
}

Assistant:

void
jpg_error_handler (j_common_ptr /*cinfo*/)
{
    throw util::Exception("JPEG format not recognized");
}